

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

EdgeIdx __thiscall Escape::CGraph::getEdgeCount(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  long lVar1;
  bool bVar2;
  long local_50;
  EdgeIdx multiplicity;
  EdgeIdx found;
  EdgeIdx mid;
  EdgeIdx high;
  EdgeIdx low;
  VertexIdx v2_local;
  VertexIdx v1_local;
  CGraph *this_local;
  
  if (v1 < this->nVertices) {
    high = this->offsets[v1];
    mid = this->offsets[v1 + 1] + -1;
    while (high <= mid) {
      lVar1 = (high + mid) / 2;
      if (this->nbors[lVar1] == v2) {
        local_50 = 1;
        multiplicity = lVar1;
        while( true ) {
          multiplicity = multiplicity + 1;
          bVar2 = false;
          if (multiplicity <= mid) {
            bVar2 = this->nbors[multiplicity] == v2;
          }
          if (!bVar2) break;
          local_50 = local_50 + 1;
        }
        while( true ) {
          multiplicity = lVar1 + -1;
          bVar2 = false;
          if (high <= multiplicity) {
            bVar2 = this->nbors[multiplicity] == v2;
          }
          if (!bVar2) break;
          local_50 = local_50 + 1;
          lVar1 = multiplicity;
        }
        return local_50;
      }
      if (v2 < this->nbors[lVar1]) {
        mid = lVar1 + -1;
      }
      else {
        high = lVar1 + 1;
      }
    }
  }
  return -1;
}

Assistant:

EdgeIdx CGraph::getEdgeCount(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;
    EdgeIdx found, multiplicity=0;

    while (low <= high) {
        mid = (low + high) / 2;
        if (nbors[mid] == v2) {
            multiplicity = 1;
            found = mid+1;
            while ( found <= high && nbors[found] == v2) {
                multiplicity++;
                found ++;
            }
            found = mid-1;
            while ( found >= low && nbors[found] == v2) {
                multiplicity ++;
                found --;
            }
            return multiplicity;
        }
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return -1;
}